

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  byte bVar1;
  cs_detail *pcVar2;
  uint8_t uVar3;
  _Bool _Var4;
  uint uVar5;
  MCOperand *op;
  uint8_t *puVar6;
  uint local_4c;
  ulong local_40;
  int64_t imm;
  uint reg;
  MCOperand *Op;
  int opsize;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  uVar3 = '\0';
  op = MCInst_getOperand(MI,OpNo);
  _Var4 = MCOperand_isReg(op);
  if (_Var4) {
    uVar5 = MCOperand_getReg(op);
    printRegName(O,uVar5);
    if (MI->csh->detail != CS_OPT_OFF) {
      if ((MI->csh->doing_mem & 1U) == 0) {
        puVar6 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
        puVar6[0] = '\x01';
        puVar6[1] = '\0';
        puVar6[2] = '\0';
        puVar6[3] = '\0';
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = uVar5;
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] =
             MI->csh->regsize_map[uVar5];
        pcVar2 = MI->flat_insn->detail;
        (pcVar2->field_6).x86.op_count = (pcVar2->field_6).x86.op_count + '\x01';
      }
      else {
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x4a) = uVar5;
      }
    }
    if (MI->op1_size != '\0') {
      return;
    }
    MI->op1_size = MI->csh->regsize_map[uVar5];
    return;
  }
  _Var4 = MCOperand_isImm(op);
  if (!_Var4) {
    return;
  }
  local_40 = MCOperand_getImm(op);
  uVar5 = MCInst_getOpcode(MI);
  if (((((((uVar5 - 0x15 < 2) || (uVar5 - 0x3b < 2)) || (uVar5 == 0x3e)) ||
        ((uVar5 - 0x6a < 2 || (uVar5 - 0x6d < 2)))) ||
       ((uVar5 - 0xc6 < 2 || ((uVar5 - 0xc9 < 2 || (uVar5 == 0x212)))))) ||
      ((uVar5 == 0x21b ||
       ((((((uVar5 - 0x21f < 2 || (uVar5 == 0x222)) || (uVar5 == 0x4df)) ||
          (((uVar5 == 0x4ea || (uVar5 == 0x4fd)) ||
           ((uVar5 == 0x509 || ((uVar5 == 0x514 || (uVar5 == 0x662)))))))) || (uVar5 - 0x667 < 2))
        || (((uVar5 - 0x75a < 2 || (uVar5 - 0x75d < 2)) || (uVar5 == 0x76a)))))))) ||
     (((((uVar5 == 0x8d6 || (uVar5 == 0x905)) ||
        (((uVar5 == 0x908 || ((uVar5 == 0x925 || (uVar5 == 0x928)))) || (uVar5 == 0x966)))) ||
       (((((((uVar5 == 0x969 || (uVar5 == 0x97e)) || (uVar5 == 0x981)) ||
           ((uVar5 == 0x9ae || (uVar5 == 0x9b1)))) || (uVar5 == 0x9c7)) ||
         (((uVar5 == 0x9ca || (uVar5 - 0x9ea < 2)) ||
          ((uVar5 == 0x9ed || (((uVar5 == 0xa49 || (uVar5 == 0xa4c)) || (uVar5 == 0xa71)))))))) ||
        ((uVar5 == 0xa74 || (uVar5 - 0xaed < 2)))))) ||
      ((uVar5 - 0xaf0 < 2 || (((uVar5 - 0xb54 < 6 || (uVar5 - 0x1863 < 2)) || (uVar5 - 0x1866 < 2)))
       ))))) {
    local_40 = local_40 & 0xff;
    uVar3 = '\x01';
  }
  uVar5 = MI->flat_insn->id;
  if (uVar5 != 0x19) {
    if (uVar5 == 0x95) {
      if (((long)local_40 < 0) || (9 < (long)local_40)) {
        local_40 = local_40 & 0xffff;
        SStream_concat(O,"0x%x",local_40);
      }
      else {
        SStream_concat(O,"%u",local_40);
      }
      goto LAB_00205f5e;
    }
    if (uVar5 - 0x9c < 2) {
      if (OpNo == 1) {
        local_40 = local_40 & 0xffff;
        uVar3 = '\x02';
      }
      if ((long)local_40 < 10) {
        SStream_concat(O,"%lu",local_40);
      }
      else {
        SStream_concat(O,"0x%lx",local_40);
      }
      goto LAB_00205f5e;
    }
    if ((uVar5 != 0x145) && (uVar5 != 0x147)) {
      if ((long)local_40 < 0) {
        if ((long)local_40 < -9) {
          SStream_concat(O,"-0x%lx",-local_40);
        }
        else {
          SStream_concat(O,"-%lu",-local_40);
        }
      }
      else if ((long)local_40 < 10) {
        SStream_concat(O,"%lu",local_40);
      }
      else {
        SStream_concat(O,"0x%lx",local_40);
      }
      goto LAB_00205f5e;
    }
  }
  if (((long)local_40 < 0) || (9 < (long)local_40)) {
    if (MI->op1_size == '\0') {
      bVar1 = MI->imm_size;
    }
    else {
      bVar1 = MI->op1_size;
    }
    local_4c = (uint)bVar1;
    local_40 = arch_masks[(int)local_4c] & local_40;
    SStream_concat(O,"0x%lx",local_40);
  }
  else {
    SStream_concat(O,"%u",local_40);
  }
LAB_00205f5e:
  if (MI->csh->detail != CS_OPT_OFF) {
    if ((MI->csh->doing_mem & 1U) == 0) {
      puVar6 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
      puVar6[0] = '\x02';
      puVar6[1] = '\0';
      puVar6[2] = '\0';
      puVar6[3] = '\0';
      if (uVar3 == '\0') {
        if ((MI->flat_insn->detail->field_6).x86.op_count == '\0') {
          MI->flat_insn->detail->groups
          [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->imm_size;
        }
        else if ((MI->flat_insn->id == 0x9c) || (MI->flat_insn->id == 0x9d)) {
          MI->flat_insn->detail->groups
          [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->imm_size;
        }
        else {
          MI->flat_insn->detail->groups
          [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] =
               *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50);
        }
      }
      else {
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = uVar3;
      }
      *(ulong *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = local_40;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).x86.op_count = (pcVar2->field_6).x86.op_count + '\x01';
    }
    else {
      *(ulong *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x56) = local_40;
    }
  }
  return;
}

Assistant:

static void _printOperand(MCInst *MI, MCOperand *MO, SStream *O)
{
	if (MCOperand_isReg(MO)) {
		unsigned reg;

		reg = MCOperand_getReg(MO);
		SStream_concat0(O, getRegisterName(reg));

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				if (MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base == ARM_REG_INVALID)
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base = reg;
				else
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = reg;
			} else {
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = reg;
				MI->flat_insn->detail->xcore.op_count++;
			}
		}
	} else if (MCOperand_isImm(MO)) {
		int32_t Imm = (int32_t)MCOperand_getImm(MO);

		if (Imm >= 0) {
			if (Imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", Imm);
			else
				SStream_concat(O, "%u", Imm);
		} else {
			if (Imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -Imm);
			else
				SStream_concat(O, "-%u", -Imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = Imm;
			} else {
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_IMM;
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].imm = Imm;
				MI->flat_insn->detail->xcore.op_count++;
			}
		}
	}
}